

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_backup_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string local_1a8;
  byte local_181;
  string local_180;
  byte local_15e;
  byte local_15d;
  byte local_15c;
  byte local_15b;
  byte local_15a;
  byte local_159;
  string local_158;
  byte local_136;
  byte local_135;
  byte local_121;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint32_t local_1c;
  InputAPI *pIStack_18;
  uint32_t ind_local;
  InputAPI *this_local;
  
  local_121 = 0;
  local_135 = 0;
  local_136 = 0;
  local_159 = 0;
  local_15a = 0;
  local_15b = 0;
  local_15c = 0;
  local_15d = 0;
  local_15e = 0;
  local_181 = 0;
  local_1c = ind;
  pIStack_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_120,(re2c *)(ulong)ind,ind);
    local_121 = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_100,&local_120,&poVar1->yych);
    local_135 = 1;
    std::operator+(&local_e0,&local_100," = ");
    local_136 = 1;
    Opt::yychConversion_abi_cxx11_(&local_158,(Opt *)&opts);
    local_159 = 1;
    std::operator+(&local_c0,&local_e0,&local_158);
    local_15a = 1;
    std::operator+(&local_a0,&local_c0,"*(");
    local_15b = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_80,&local_a0,&poVar1->yymarker);
    local_15c = 1;
    std::operator+(&local_60,&local_80," = ");
    local_15d = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_40,&local_60,&poVar1->yycursor);
    local_15e = 1;
    std::operator+(__return_storage_ptr__,&local_40,");\n");
  }
  else {
    stmt_backup_abi_cxx11_(&local_180,this,ind);
    local_181 = 1;
    stmt_peek_abi_cxx11_(&local_1a8,this,local_1c);
    std::operator+(__return_storage_ptr__,&local_180,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  if ((local_181 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_180);
  }
  if ((local_15e & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_15d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_15c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_15b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_15a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_159 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_158);
  }
  if ((local_136 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((local_135 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
  }
  if ((local_121 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backup_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*(" + opts->yymarker + " = " + opts->yycursor + ");\n"
		: stmt_backup (ind) + stmt_peek (ind);
}